

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O3

uint8_t * apx_attributeParser_parse_type_attributes
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_typeAttributes_t *attr)

{
  byte bVar1;
  apx_typeAttributes_t *paVar2;
  apx_typeAttributes_t *paVar3;
  _Bool unary_minus;
  apx_error_t aVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  byte *pBegin;
  byte *pEnd;
  adt_str_t *pElem;
  ushort **ppuVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  apx_valueTable_t *computation;
  byte *pbVar10;
  double d;
  int32_t local_8c;
  apx_typeAttributes_t *local_88;
  apx_attributeParserValueTableState_t local_80;
  void **local_38;
  
  if (((end == (uint8_t *)0x0) || (begin == (uint8_t *)0x0)) || (end < begin)) {
    if (self != (apx_attributeParser_t *)0x0) {
      self->last_error = 1;
      self->error_next = begin;
      return (uint8_t *)0x0;
    }
LAB_001231f4:
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                  ,0x17a,
                  "void apx_attributeParser_set_error(apx_attributeParser_t *, apx_error_t, const uint8_t *)"
                 );
  }
  if (end <= begin) {
    return begin;
  }
LAB_00122c31:
  puVar5 = bstr_lstrip(begin,end);
  if (puVar5 == end) {
    return puVar5;
  }
  puVar6 = bstr_match_cstr(puVar5,end,"VT");
  if (puVar5 < puVar6) {
    paVar2 = local_88;
    if (end <= puVar5 + 2) {
LAB_0012307d:
      local_88 = paVar2;
      puVar6 = puVar5 + 2;
      computation = (apx_valueTable_t *)0x0;
      goto LAB_00123082;
    }
    if (puVar5[2] == '(') {
      puVar6 = puVar5 + 3;
      local_80.range.is_signed_range = false;
      local_80.range.lower = (anon_union_4_2_43a9a9ed_for_lower)0x0;
      local_80.range.upper = (anon_union_4_2_43a9a9ed_for_upper)0x0;
      local_80.num_count = 0;
      local_80.last_was_string = false;
      adt_ary_create(&local_80.values,adt_str_vdelete);
      paVar3 = attr;
      paVar2 = local_88;
joined_r0x00122cad:
      do {
        local_88 = paVar3;
        if ((end <= puVar6) || (pBegin = bstr_lstrip(puVar6,end), paVar2 = local_88, end <= pBegin))
        goto LAB_0012307d;
        bVar1 = *pBegin;
        pbVar10 = pBegin;
        if (local_80.last_was_string == false) {
          if ((ulong)bVar1 == 0x22) goto LAB_00122cf9;
          if (bVar1 == 0x2d) {
            unary_minus = true;
            pbVar10 = pBegin + 1;
          }
          else {
            ppuVar7 = __ctype_b_loc();
            unary_minus = false;
            if ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
              pbVar10 = (byte *)0x0;
              goto LAB_00123061;
            }
          }
          if (local_80.num_count == 1) {
            pEnd = apx_attributeParser_parse_upper_limit(pbVar10,end,unary_minus,&local_80.range);
          }
          else if (local_80.num_count == 0) {
            pEnd = apx_attributeParser_parse_lower_limit(pbVar10,end,unary_minus,&local_80.range);
          }
          else {
            pEnd = (byte *)0x0;
          }
          if (pbVar10 < pEnd) {
            pbVar10 = pEnd;
          }
          local_80.num_count = local_80.num_count + 1;
          goto LAB_00122db6;
        }
        if (bVar1 != 0x22) {
          pbVar10 = (byte *)0x0;
LAB_00123061:
          aVar4 = 3;
          pBegin = pbVar10;
          if (self == (apx_attributeParser_t *)0x0) goto LAB_001231f4;
LAB_00123076:
          self->last_error = aVar4;
          self->error_next = pBegin;
          attr = local_88;
          paVar2 = local_88;
          goto LAB_0012307d;
        }
LAB_00122cf9:
        local_80.last_was_string = true;
        pEnd = bstr_match_pair(pBegin,end,'\"','\"','\\');
        if (pBegin < pEnd) {
          pElem = adt_str_new_bstr(pBegin + 1,pEnd);
          if (pElem != (adt_str_t *)0x0) {
            adt_ary_push(&local_80.values,pElem);
            pbVar10 = pEnd + 1;
            goto LAB_00122db6;
          }
          aVar4 = 2;
          if (self != (apx_attributeParser_t *)0x0) goto LAB_00123076;
          goto LAB_001231f4;
        }
LAB_00122db6:
        attr = local_88;
        if (pEnd == (byte *)0x0) goto LAB_00123061;
        paVar2 = local_88;
        if (pbVar10 <= pBegin) goto LAB_0012307d;
        if (end < pbVar10) {
          __assert_fail("result <= end",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                        ,0x367,
                        "const uint8_t *apx_attributeParser_parse_value_table(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_valueTable_t **)"
                       );
        }
        puVar6 = bstr_lstrip(pbVar10,end);
        paVar2 = local_88;
        paVar3 = local_88;
        if (*puVar6 == ',') {
          puVar6 = puVar6 + 1;
          goto joined_r0x00122cad;
        }
      } while (*puVar6 != ')');
      computation = apx_attributeParser_create_value_table_from_state(self,&local_80);
      if (computation == (apx_valueTable_t *)0x0) {
        self->error_next = puVar6;
      }
LAB_00123105:
      puVar6 = puVar6 + 1;
      goto LAB_00123082;
    }
  }
  else {
    puVar8 = bstr_match_cstr(puVar5,end,"RS");
    puVar6 = puVar5 + 2;
    puVar9 = puVar5;
    if (puVar8 <= puVar5) {
LAB_001231a0:
      if (self != (apx_attributeParser_t *)0x0) {
        self->last_error = 3;
        self->error_next = puVar9;
        return puVar5;
      }
      goto LAB_001231f4;
    }
    if (end <= puVar6) {
      computation = (apx_valueTable_t *)0x0;
      goto LAB_00123082;
    }
    if (*puVar6 != '(') goto LAB_00123053;
    puVar6 = puVar5 + 3;
    local_80.range.lower = (anon_union_4_2_43a9a9ed_for_lower)0x0;
    local_80.range.upper = (anon_union_4_2_43a9a9ed_for_upper)0x0;
    local_80.range.is_signed_range = false;
    local_80.values.pDestructor = (_func_void_void_ptr *)0x0;
    local_80.values.ppAlloc = (void **)0x0;
    local_80.values.pFirst = (void **)0x0;
    local_80.values.s32AllocLen = 0;
LAB_00122e68:
    do {
      if (end <= puVar6) {
LAB_00122fe9:
        puVar9 = self->error_next;
LAB_00122ff1:
        if (puVar9 == (uint8_t *)0x0) {
          self->last_error = 3;
          self->error_next = puVar6;
        }
        paVar2 = local_88;
        if (local_80.values.pDestructor != (_func_void_void_ptr *)0x0) {
          free(local_80.values.pDestructor);
          paVar2 = local_88;
        }
        goto LAB_0012307d;
      }
      puVar9 = bstr_lstrip(puVar6,end);
      if (end <= puVar9) {
switchD_00122eb5_default:
        puVar6 = (uint8_t *)0x0;
        goto LAB_00122fe9;
      }
      local_38 = (void **)0x0;
      local_8c = 0;
      switch(local_80.values.s32AllocLen) {
      case 0:
        puVar6 = apx_attributeParser_parse_lower_limit
                           (puVar9 + (*puVar9 == '-'),end,*puVar9 == '-',&local_80.range);
        break;
      case 1:
        puVar6 = apx_attributeParser_parse_upper_limit
                           (puVar9 + (*puVar9 == '-'),end,*puVar9 == '-',&local_80.range);
        break;
      case 2:
        puVar6 = apx_parserBase_parse_double(puVar9,end,(double *)&local_38);
        if (puVar9 < puVar6) {
          local_80.values.ppAlloc = local_38;
        }
        break;
      case 3:
        puVar6 = apx_parserBase_parse_i32(puVar9,end,&local_8c);
        if (puVar9 < puVar6) {
          local_80.values.pFirst = (void **)CONCAT44(local_80.values.pFirst._4_4_,local_8c);
        }
        break;
      case 4:
        puVar6 = apx_parserBase_parse_i32(puVar9,end,&local_8c);
        if (puVar9 < puVar6) {
          local_80.values.pFirst = (void **)CONCAT44(local_8c,local_80.values.pFirst._0_4_);
        }
        break;
      case 5:
        puVar6 = bstr_match_pair(puVar9,end,'\"','\"','\\');
        if (puVar6 <= puVar9) break;
        local_80.values.pDestructor = (_func_void_void_ptr *)bstr_make_cstr(puVar9 + 1,puVar6);
        if (local_80.values.pDestructor != (_func_void_void_ptr *)0x0) {
          puVar6 = puVar6 + 1;
          break;
        }
        if (self != (apx_attributeParser_t *)0x0) {
          self->last_error = 2;
          self->error_next = puVar9;
          puVar6 = (uint8_t *)0x0;
          goto LAB_00122ff1;
        }
        goto LAB_001231f4;
      default:
        goto switchD_00122eb5_default;
      }
      local_80.values.s32AllocLen = local_80.values.s32AllocLen + 1;
      if (puVar6 <= puVar9) goto switchD_00122eb5_default;
      if (end < puVar6) {
        __assert_fail("result <= end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                      ,0x397,
                      "const uint8_t *apx_attributeParser_parse_rational_scaling(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_rationalScaling_t **)"
                     );
      }
      puVar6 = bstr_lstrip(puVar6,end);
      if (*puVar6 == ',') {
        puVar6 = puVar6 + 1;
        goto LAB_00122e68;
      }
    } while (*puVar6 != ')');
    computation = (apx_valueTable_t *)
                  apx_attributeParser_create_rational_scaling_from_state
                            ((apx_attributeParserRationalScalingState_t *)&local_80);
    if (local_80.values.pDestructor != (_func_void_void_ptr *)0x0) {
      free(local_80.values.pDestructor);
    }
    if (computation != (apx_valueTable_t *)0x0) goto LAB_00123105;
    if (self == (apx_attributeParser_t *)0x0) goto LAB_001231f4;
    self->last_error = 2;
    self->error_next = puVar6;
  }
LAB_00123053:
  computation = (apx_valueTable_t *)0x0;
  puVar6 = (uint8_t *)0x0;
LAB_00123082:
  puVar9 = puVar5 + 2;
  if (puVar6 <= puVar9) goto LAB_001231a0;
  if (end < puVar6) {
    __assert_fail("result <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                  ,0x246,
                  "const uint8_t *apx_attributeParser_parse_single_type_attribute(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_typeAttributes_t *)"
                 );
  }
  if (computation != (apx_valueTable_t *)0x0) {
    apx_typeAttributes_append_computation(attr,&computation->base);
  }
  if (puVar6 <= puVar5) {
    return puVar5;
  }
  puVar5 = bstr_lstrip(puVar6,end);
  if (puVar5 == end) {
    return puVar5;
  }
  if (*puVar5 != ',') {
    if (self != (apx_attributeParser_t *)0x0) {
      self->last_error = 3;
      self->error_next = puVar5;
      return (uint8_t *)0x0;
    }
    goto LAB_001231f4;
  }
  begin = puVar5 + 1;
  if (end <= begin) {
    return begin;
  }
  goto LAB_00122c31;
}

Assistant:

uint8_t const* apx_attributeParser_parse_type_attributes(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_typeAttributes_t* attr)
{
   uint8_t const* next = begin;
   if ((end < begin) || (begin == NULL) || (end == NULL))
   {
      apx_attributeParser_set_error(self, APX_INVALID_ARGUMENT_ERROR, begin);
      return NULL;
   }
   while (next < end)
   {
      next = bstr_lstrip(next, end);
      if (next == end)
      {
         break;
      }
      uint8_t const* result = apx_attributeParser_parse_single_type_attribute(self, next, end, attr);
      if (result > next)
      {
         next = bstr_lstrip(result, end);
         if (next == end)
         {
            break;
         }
         if (*next == ',')
         {
            next++;
         }
         else
         {
            apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
            next = NULL;
            break;
         }
      }
      else
      {
         break;
      }
   }
   return next;
}